

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O0

uint32_t bssl::ssl_hash_session_id(Span<const_unsigned_char> session_id)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  size_t sVar4;
  uchar *puVar5;
  uchar *puStack_30;
  uint32_t hash;
  uchar local_1c [4];
  undefined1 auStack_18 [4];
  uint8_t tmp_storage [4];
  Span<const_unsigned_char> session_id_local;
  
  _auStack_18 = session_id.data_;
  sVar4 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)auStack_18);
  if (sVar4 < 4) {
    ::OPENSSL_memset(local_1c,0,4);
    puVar5 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)auStack_18);
    sVar4 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)auStack_18);
    ::OPENSSL_memcpy(local_1c,puVar5,sVar4);
    Span<unsigned_char_const>::Span<4ul>
              ((Span<unsigned_char_const> *)&stack0xffffffffffffffd0,&local_1c);
    _auStack_18 = puStack_30;
  }
  puVar5 = Span<const_unsigned_char>::operator[]((Span<const_unsigned_char> *)auStack_18,0);
  uVar1 = *puVar5;
  puVar5 = Span<const_unsigned_char>::operator[]((Span<const_unsigned_char> *)auStack_18,1);
  uVar2 = *puVar5;
  puVar5 = Span<const_unsigned_char>::operator[]((Span<const_unsigned_char> *)auStack_18,2);
  uVar3 = *puVar5;
  puVar5 = Span<const_unsigned_char>::operator[]((Span<const_unsigned_char> *)auStack_18,3);
  return CONCAT13(*puVar5,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
}

Assistant:

uint32_t ssl_hash_session_id(Span<const uint8_t> session_id) {
  // Take the first four bytes of |session_id|. Session IDs are generated by the
  // server randomly, so we can assume even using the first four bytes results
  // in a good distribution.
  uint8_t tmp_storage[sizeof(uint32_t)];
  if (session_id.size() < sizeof(tmp_storage)) {
    OPENSSL_memset(tmp_storage, 0, sizeof(tmp_storage));
    OPENSSL_memcpy(tmp_storage, session_id.data(), session_id.size());
    session_id = tmp_storage;
  }

  uint32_t hash = ((uint32_t)session_id[0]) | ((uint32_t)session_id[1] << 8) |
                  ((uint32_t)session_id[2] << 16) |
                  ((uint32_t)session_id[3] << 24);

  return hash;
}